

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::DummyDataParameter::Clear(DummyDataParameter *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::FillerParameter>::TypeHandler>
            (&(this->data_filler_).super_RepeatedPtrFieldBase);
  (this->num_).current_size_ = 0;
  (this->channels_).current_size_ = 0;
  (this->height_).current_size_ = 0;
  (this->width_).current_size_ = 0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
            (&(this->shape_).super_RepeatedPtrFieldBase);
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void DummyDataParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.DummyDataParameter)
  data_filler_.Clear();
  num_.Clear();
  channels_.Clear();
  height_.Clear();
  width_.Clear();
  shape_.Clear();
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}